

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_viewer.c
# Opt level: O1

oonf_telnet_result
oonf_viewer_telnet_handler
          (autobuf *out,abuf_template_storage *storage,char *cmd,char *param,
          oonf_viewer_template *templates,size_t count)

{
  int iVar1;
  oonf_telnet_result oVar2;
  
  if ((param == (char *)0x0) || (*param == '\0')) {
    abuf_appendf(out,"Error, \'%s\' command needs a parameter\n",cmd);
  }
  iVar1 = oonf_viewer_call_subcommands(out,storage,param,templates,count);
  if (iVar1 == 0) {
    oVar2 = TELNET_RESULT_ACTIVE;
  }
  else if (iVar1 < 0) {
    oVar2 = TELNET_RESULT_INTERNAL_ERROR;
  }
  else {
    oVar2 = TELNET_RESULT_ACTIVE;
    abuf_appendf(out,"Unknown parameter for command \'%s\': %s\n",cmd,param);
  }
  return oVar2;
}

Assistant:

enum oonf_telnet_result
oonf_viewer_telnet_handler(struct autobuf *out, struct abuf_template_storage *storage, const char *cmd,
  const char *param, struct oonf_viewer_template *templates, size_t count)
{
  int result;

  /* sanity check */
  if (param == NULL || *param == 0) {
    abuf_appendf(out, "Error, '%s' command needs a parameter\n", cmd);
  }

  /* call template based subcommands */
  result = oonf_viewer_call_subcommands(out, storage, param, templates, count);
  if (result == 0) {
    return TELNET_RESULT_ACTIVE;
  }
  if (result < 0) {
    return TELNET_RESULT_INTERNAL_ERROR;
  }

  abuf_appendf(out, "Unknown parameter for command '%s': %s\n", cmd, param);
  return TELNET_RESULT_ACTIVE;
}